

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromZeroCopyStream
          (UnknownFieldSet *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  undefined1 auStack_68 [8];
  CodedInputStream coded_input;
  
  auStack_68 = (undefined1  [8])0x0;
  coded_input.buffer_ = (uint8 *)0x0;
  coded_input.input_._0_6_ = 0;
  coded_input.input_._6_2_ = 0;
  coded_input.total_bytes_read_ = 0;
  coded_input.overflow_bytes_._0_1_ = 0;
  coded_input.overflow_bytes_._1_1_ = 0;
  coded_input.last_tag_ = 0x7fffffff;
  coded_input.legitimate_message_end_ = false;
  coded_input.aliasing_enabled_ = false;
  coded_input._38_2_ = 0;
  coded_input.current_limit_ = 0x7fffffff;
  coded_input.buffer_size_after_limit_ = io::CodedInputStream::default_recursion_limit_;
  coded_input.total_bytes_limit_ = io::CodedInputStream::default_recursion_limit_;
  coded_input.recursion_limit_ = 0;
  coded_input._60_4_ = 0;
  coded_input.extension_pool_ = (DescriptorPool *)0x0;
  coded_input.buffer_end_ = (uint8 *)input;
  io::CodedInputStream::Refresh((CodedInputStream *)auStack_68);
  bVar1 = ParseFromCodedStream(this,(CodedInputStream *)auStack_68);
  bVar1 = (bool)(bVar1 & (byte)coded_input.overflow_bytes_);
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)auStack_68);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::ParseFromZeroCopyStream(io::ZeroCopyInputStream* input) {
  io::CodedInputStream coded_input(input);
  return (ParseFromCodedStream(&coded_input) &&
          coded_input.ConsumedEntireMessage());
}